

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_2::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,ResourceDescription *resourceDesc,
          OperationSupport *writeOp,OperationSupport *readOp,PipelineCacheData *pipelineCacheData)

{
  pointer pbVar1;
  VkDevice device;
  VkDevice_s *pVVar2;
  PtrData<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> data;
  PtrData<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> data_00;
  RefBase<vk::VkDevice_s_*> *this_00;
  InstanceInterface *pIVar3;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  DeviceDriver *this_02;
  SimpleAllocator *this_03;
  OperationContext *this_04;
  ulong uVar6;
  size_type __new_size;
  ulong uVar7;
  int queueNdx;
  long lVar8;
  DeviceDriver *in_stack_fffffffffffffc98;
  RefBase<vk::VkDevice_s_*> *this_05;
  RefBase<vk::VkDevice_s_*> *pRVar9;
  RefBase<vk::VkDevice_s_*> local_348;
  VkAllocationCallbacks **local_328;
  VkPhysicalDevice local_320;
  InstanceInterface *local_318;
  Deleter<vk::VkDevice_s_*> *local_310;
  _Rb_tree_node_base *local_308;
  OperationContext *local_300;
  Resource *local_2f8;
  OperationSupport *local_2f0;
  ResourceDescription *local_2e8;
  PipelineCacheData *local_2e0;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  vector<const_char_*,_std::allocator<const_char_*>_> charDevExtensions;
  VkDeviceCreateInfo deviceInfo;
  float queuePriorities [2];
  VkDeviceQueueCreateInfo queueInfo;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_00bdcd48;
  local_2e8 = resourceDesc;
  local_2e0 = pipelineCacheData;
  this_00 = (RefBase<vk::VkDevice_s_*> *)operator_new(0x68);
  this_05 = this_00 + 1;
  local_328 = &this_00[1].m_data.deleter.m_allocator;
  this_00[1].m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_310 = &this_00[2].m_data.deleter;
  *(undefined4 *)&this_00[2].m_data.deleter.m_allocator = 0;
  local_308 = (_Rb_tree_node_base *)&this_00[2].m_data.deleter.m_allocator;
  this_00[3].m_data.object = (VkDevice_s *)0x0;
  (this_00->m_data).object = (VkDevice_s *)0x0;
  (this_00->m_data).deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  (this_00->m_data).deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00[1].m_data.object = (VkDevice_s *)0x0;
  this_00[3].m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)local_308;
  this_00[3].m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_308;
  this_00[4].m_data.object = (VkDevice_s *)0x0;
  pIVar3 = Context::getInstanceInterface(context);
  local_320 = Context::getPhysicalDevice(context);
  local_318 = pIVar3;
  local_2f8 = (Resource *)writeOp;
  local_2f0 = readOp;
  ::vk::getPhysicalDeviceQueueFamilyProperties(&queueFamilyProperties,pIVar3,local_320);
  local_300 = &this->m_opContext;
  uVar7 = 0;
  while( true ) {
    if ((ulong)(((long)queueFamilyProperties.
                       super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)queueFamilyProperties.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
    __new_size = (size_type)
                 queueFamilyProperties.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].queueCount;
    if (1 < queueFamilyProperties.
            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7].queueCount) {
      __new_size = 2;
    }
    queueInfo.pNext = (void *)0x0;
    queueInfo.flags = 0;
    queueInfo.queueFamilyIndex = 0;
    queueInfo.queueCount = 0;
    queueInfo._28_4_ = 0;
    queueInfo.sType =
         queueFamilyProperties.
         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar7].queueFlags;
    deviceInfo.sType = (VkStructureType)uVar7;
    std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::resize
              ((vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_> *)&queueInfo.pNext,
               __new_size);
    this_01 = std::
              map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData>_>_>
              ::operator[]((map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData>_>_>
                            *)local_310,&deviceInfo.sType);
    MultiQueues::QueueData::operator=(this_01,(QueueData *)&queueInfo);
    std::_Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::~_Vector_base
              ((_Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_> *)&queueInfo.pNext);
    uVar7 = (ulong)((VkStructureType)uVar7 + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO);
  }
  queueInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queuePriorities = (float  [2])&DAT_3f8000003f800000;
  for (p_Var4 = (_Rb_tree_node_base *)this_00[3].m_data.deleter.m_destroyDevice; p_Var4 != local_308
      ; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    queueInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
    queueInfo.pNext = (void *)0x0;
    queueInfo._16_8_ = (ulong)p_Var4[1]._M_color << 0x20;
    queueInfo.queueCount =
         (deUint32)((ulong)((long)p_Var4[1]._M_right - (long)p_Var4[1]._M_left) >> 3);
    queueInfo.pQueuePriorities = queuePriorities;
    std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
    push_back(&queueInfos,&queueInfo);
  }
  pvVar5 = Context::getDeviceExtensions_abi_cxx11_(context);
  charDevExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  charDevExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  charDevExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = 0;
  uVar7 = 0;
  while( true ) {
    pbVar1 = (pvVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    if ((ulong)((long)uVar6 >> 5) <= uVar7) break;
    queueInfo._0_8_ = *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8);
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&charDevExtensions,
               (char **)&queueInfo);
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x20;
  }
  deviceInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  deviceInfo.pNext = (void *)0x0;
  deviceInfo.flags = 0;
  deviceInfo.queueCreateInfoCount =
       (deUint32)
       (((long)queueInfos.
               super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)queueInfos.
              super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  deviceInfo.pQueueCreateInfos =
       queueInfos.
       super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  deviceInfo.enabledLayerCount = 0;
  deviceInfo.ppEnabledLayerNames = (char **)0x0;
  deviceInfo.enabledExtensionCount = (deUint32)(uVar6 >> 5);
  deviceInfo.ppEnabledExtensionNames =
       charDevExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  deviceInfo.pEnabledFeatures = Context::getDeviceFeatures(context);
  pIVar3 = local_318;
  pRVar9 = this_05;
  ::vk::createDevice((Move<vk::VkDevice_s_*> *)&local_348,local_318,local_320,&deviceInfo,
                     (VkAllocationCallbacks *)0x0);
  queueInfo._16_8_ = local_348.m_data.deleter.m_allocator;
  queueInfo._0_8_ = local_348.m_data.object;
  queueInfo.pNext = local_348.m_data.deleter.m_destroyDevice;
  local_348.m_data.object = (VkDevice_s *)0x0;
  local_348.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_348.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::reset(this_00);
  (this_00->m_data).deleter.m_allocator = (VkAllocationCallbacks *)queueInfo._16_8_;
  (this_00->m_data).object = (VkDevice_s *)queueInfo._0_8_;
  (this_00->m_data).deleter.m_destroyDevice = (DestroyDeviceFunc)queueInfo.pNext;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_348);
  this_02 = (DeviceDriver *)operator_new(0x4b8);
  ::vk::DeviceDriver::DeviceDriver(this_02,pIVar3,(this_00->m_data).object);
  queueInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queueInfo._4_4_ = 0;
  data._8_8_ = pRVar9;
  data.ptr = in_stack_fffffffffffffc98;
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::assignData
            ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)this_05,data);
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::~UniqueBase
            ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)&queueInfo);
  this_03 = (SimpleAllocator *)operator_new(0x220);
  device = (this_00->m_data).object;
  pVVar2 = this_00[1].m_data.object;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&queueInfo,local_318,local_320);
  ::vk::SimpleAllocator::SimpleAllocator
            (this_03,(DeviceInterface *)pVVar2,device,(VkPhysicalDeviceMemoryProperties *)&queueInfo
            );
  local_348.m_data.object = (VkDevice_s *)0x0;
  data_00._8_8_ = pRVar9;
  data_00.ptr = (Allocator *)in_stack_fffffffffffffc98;
  de::details::UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::assignData
            ((UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *)local_328,data_00);
  de::details::UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::~UniqueBase
            ((UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *)&local_348);
  for (p_Var4 = (_Rb_tree_node_base *)this_00[3].m_data.deleter.m_destroyDevice; p_Var4 != local_308
      ; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    lVar8 = 0;
    for (uVar7 = 0;
        (long)uVar7 < (long)(int)((ulong)((long)p_Var4[1]._M_right - (long)p_Var4[1]._M_left) >> 3);
        uVar7 = uVar7 + 1) {
      pVVar2 = this_00[1].m_data.object;
      (**(code **)(*(long *)pVVar2 + 8))
                (pVVar2,(this_00->m_data).object,p_Var4[1]._M_color,uVar7 & 0xffffffff,
                 (long)&(p_Var4[1]._M_left)->_M_color + lVar8);
      lVar8 = lVar8 + 8;
    }
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&charDevExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
  ~_Vector_base(&queueInfos.
                 super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
               );
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base(&queueFamilyProperties.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               );
  (this->m_opContext).m_vki = (InstanceInterface *)this_00;
  this_04 = (OperationContext *)operator_new(0x40);
  OperationContext::OperationContext
            (this_04,context,local_2e0,(DeviceInterface *)this_00[1].m_data.object,
             (this_00->m_data).object,(Allocator *)this_00[1].m_data.deleter.m_allocator);
  (this->m_opContext).m_physicalDevice = (VkPhysicalDevice)this_04;
  ResourceDescription::ResourceDescription
            ((ResourceDescription *)&(this->m_opContext).m_allocator,local_2e8);
  (this->m_resource).
  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  .m_data.ptr = local_2f8;
  *(OperationSupport **)
   &(this->m_resource).
    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    .m_data.field_0x8 = local_2f0;
  return;
}

Assistant:

BaseTestInstance (Context& context, const ResourceDescription& resourceDesc, const OperationSupport& writeOp, const OperationSupport& readOp, PipelineCacheData& pipelineCacheData)
		: TestInstance		(context)
		, m_queues			(new MultiQueues(context))
		, m_opContext		(new OperationContext(context, pipelineCacheData, m_queues->getDeviceInterface(), m_queues->getDevice(), m_queues->getAllocator()))
		, m_resourceDesc	(resourceDesc)
		, m_writeOp			(writeOp)
		, m_readOp			(readOp)
	{
	}